

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O2

void __thiscall UnitTest_parser_exp1::Run(UnitTest_parser_exp1 *this)

{
  __uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> _Var1;
  ExpressionList *pEVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  allocator local_39;
  string local_38;
  __uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_18;
  
  std::__cxx11::string::string((string *)&local_38,"a = 1 + 2 + 3",&local_39);
  anon_unknown.dwarf_6bcd::Parse((anon_unknown_dwarf_6bcd *)&local_18,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pEVar2 = ASTFind<luna::ExpressionList,AcceptAST>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_18,(AcceptAST *)&local_38);
  puVar3 = (pEVar2->exp_list_).
           super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(pEVar2->exp_list_).
            super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 != 8) {
    std::__cxx11::string::string
              ((string *)&local_38,"\'exp_list->exp_list_.size() == 1\'",&local_39);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    puVar3 = (pEVar2->exp_list_).
             super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  _Var1._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
  super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
       (puVar3->_M_t).
       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t;
  if ((_Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
      _Var1._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == (SyntaxTree *)0x0) {
LAB_00147a78:
    std::__cxx11::string::string((string *)&local_38,"\'bin_exp\'",&local_39);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(_Var1._M_t.
                           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                           .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
                           &luna::SyntaxTree::typeinfo,&luna::BinaryExpression::typeinfo,0);
    if (lVar4 == 0) goto LAB_00147a78;
  }
  if (*(int *)(lVar4 + 0x30) != 0x2b) {
    std::__cxx11::string::string
              ((string *)&local_38,"\'bin_exp->op_token_.token_ == \'+\'\'",&local_39);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (*(long *)(lVar4 + 0x10) == 0) {
LAB_00147aff:
    std::__cxx11::string::string
              ((string *)&local_38,"\'dynamic_cast<luna::Terminator *>(bin_exp->right_.get())\'",
               &local_39);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(lVar4 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar5 == 0) goto LAB_00147aff;
  }
  if (*(long *)(lVar4 + 8) == 0) {
LAB_00147b52:
    std::__cxx11::string::string((string *)&local_38,"\'bin_exp\'",&local_39);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(*(long *)(lVar4 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::BinaryExpression::typeinfo,0);
    if (lVar4 == 0) goto LAB_00147b52;
  }
  if (*(int *)(lVar4 + 0x30) != 0x2b) {
    std::__cxx11::string::string
              ((string *)&local_38,"\'bin_exp->op_token_.token_ == \'+\'\'",&local_39);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (*(long *)(lVar4 + 8) == 0) {
LAB_00147bd9:
    std::__cxx11::string::string
              ((string *)&local_38,"\'dynamic_cast<luna::Terminator *>(bin_exp->left_.get())\'",
               &local_39);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    lVar5 = __dynamic_cast(*(long *)(lVar4 + 8),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar5 == 0) goto LAB_00147bd9;
  }
  if (*(long *)(lVar4 + 0x10) != 0) {
    lVar4 = __dynamic_cast(*(long *)(lVar4 + 0x10),&luna::SyntaxTree::typeinfo,
                           &luna::Terminator::typeinfo,0);
    if (lVar4 != 0) goto LAB_00147c56;
  }
  std::__cxx11::string::string
            ((string *)&local_38,"\'dynamic_cast<luna::Terminator *>(bin_exp->right_.get())\'",
             &local_39);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
LAB_00147c56:
  if (local_18._M_t.
      super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)0x0) {
    (*(*(_func_int ***)
        local_18._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl)[1])();
  }
  return;
}

Assistant:

TEST_CASE(parser_exp1)
{
    auto root = Parse("a = 1 + 2 + 3");
    auto exp_list = ASTFind<luna::ExpressionList>(root, AcceptAST());
    EXPECT_TRUE(exp_list->exp_list_.size() == 1);
    auto &exp = exp_list->exp_list_[0];
    auto bin_exp = dynamic_cast<luna::BinaryExpression *>(exp.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));

    // 1 + 2
    bin_exp = dynamic_cast<luna::BinaryExpression *>(bin_exp->left_.get());
    EXPECT_TRUE(bin_exp);
    EXPECT_TRUE(bin_exp->op_token_.token_ == '+');
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->left_.get()));
    EXPECT_TRUE(dynamic_cast<luna::Terminator *>(bin_exp->right_.get()));
}